

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

ostream * google::operator<<(ostream *os,Counter_t *param_2)

{
  Counter_t *this;
  LogStream *pLVar1;
  ostream *poVar2;
  int64 iVar3;
  bool bVar4;
  LogStream *local_b0;
  LogMessage local_88;
  LogMessageVoidify local_21;
  LogStream *local_20;
  LogStream *log;
  Counter_t *param_1_local;
  ostream *os_local;
  
  log = (LogStream *)param_2;
  param_1_local = (Counter_t *)os;
  if (os == (ostream *)0x0) {
    local_b0 = (LogStream *)0x0;
  }
  else {
    local_b0 = (LogStream *)
               __dynamic_cast(os,&std::ostream::typeinfo,&LogMessage::LogStream::typeinfo,0);
  }
  local_20 = local_b0;
  bVar4 = false;
  if (local_b0 != (LogStream *)0x0) {
    pLVar1 = LogMessage::LogStream::self(local_b0);
    bVar4 = local_b0 == pLVar1;
  }
  this = param_1_local;
  if (bVar4) {
    iVar3 = LogMessage::LogStream::ctr(local_20);
    std::ostream::operator<<(this,iVar3);
    return (ostream *)param_1_local;
  }
  LogMessageVoidify::LogMessageVoidify(&local_21);
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
             ,0x7b0);
  poVar2 = LogMessage::stream(&local_88);
  poVar2 = std::operator<<(poVar2,"Check failed: log && log == log->self() ");
  poVar2 = std::operator<<(poVar2,"You must not use COUNTER with non-glog ostream");
  LogMessageVoidify::operator&(&local_21,poVar2);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_88);
}

Assistant:

ostream& operator<<(ostream& os, const Counter_t&) {
#ifdef DISABLE_RTTI
  LogMessage::LogStream* log = static_cast<LogMessage::LogStream*>(&os);
#else
  auto* log = dynamic_cast<LogMessage::LogStream*>(&os);
#endif
  CHECK(log && log == log->self())
      << "You must not use COUNTER with non-glog ostream";
  os << log->ctr();
  return os;
}